

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_20::ShapeFunctions
          (ChElementHexaCorot_20 *this,ShapeVector *N,double r,double s,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 in_register_00001248 [56];
  undefined1 in_register_00001288 [56];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar20 [32];
  undefined1 auVar24 [32];
  
  auVar13._8_56_ = in_register_00001288;
  auVar13._0_8_ = t;
  auVar12._8_56_ = in_register_00001248;
  auVar12._0_8_ = s;
  auVar19._8_8_ = 0x3ff0000000000000;
  auVar19._0_8_ = 0x3ff0000000000000;
  auVar20._16_8_ = 0x3ff0000000000000;
  auVar20._0_16_ = auVar19;
  auVar20._24_8_ = 0x3ff0000000000000;
  auVar10 = auVar13._0_16_;
  auVar11 = vbroadcastsd_avx512f(auVar10);
  auVar18._8_8_ = r;
  auVar18._0_8_ = r;
  auVar4 = vunpcklpd_avx(auVar18,auVar12._0_16_);
  auVar15._16_16_ = auVar12._0_16_;
  auVar15._0_16_ = auVar18;
  auVar5 = vpermpd_avx2(ZEXT1632(auVar4),0x11);
  auVar7 = vfnmadd213sd_fma(auVar10,auVar10,ZEXT816(0x3ff0000000000000));
  dVar1 = auVar11._0_8_ + 1.0;
  auVar20 = vsubpd_avx(auVar20,auVar5);
  auVar23._0_8_ = auVar5._0_8_ + 1.0;
  auVar23._8_8_ = auVar5._8_8_ + 1.0;
  auVar24._16_8_ = auVar5._16_8_ + 1.0;
  auVar24._0_16_ = auVar23;
  auVar24._24_8_ = auVar5._24_8_ + 1.0;
  auVar10 = vfnmadd213pd_fma(auVar4,auVar4,auVar19);
  auVar21._0_16_ = auVar20._0_16_;
  auVar5 = vblendpd_avx(auVar20,auVar24,6);
  auVar12 = vpermi2pd_avx512f(_DAT_00997580,ZEXT864((ulong)(1.0 - t)),
                              ZEXT1664(CONCAT88(dVar1,dVar1)));
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar8 = vxorpd_avx512vl(auVar18,auVar4);
  auVar4 = vunpckhpd_avx(auVar20._16_16_,auVar23);
  auVar9._8_8_ = 0x3fc0000000000000;
  auVar9._0_8_ = 0x3fc0000000000000;
  auVar9 = vmulpd_avx512vl(auVar4,auVar9);
  auVar17 = vshufpd_avx(ZEXT1632(auVar8),auVar15,2);
  auVar6 = vpermpd_avx2(auVar15,0x5a);
  auVar15 = vsubpd_avx(auVar17,auVar6);
  auVar16._0_8_ = auVar6._0_8_ + r;
  auVar16._8_8_ = auVar6._8_8_ + r;
  auVar16._16_8_ = auVar6._16_8_ + s;
  auVar16._24_8_ = auVar6._24_8_ + in_register_00001248._0_8_;
  auVar17 = vblendpd_avx(auVar24,ZEXT1632(auVar9),3);
  auVar20 = vblendpd_avx(auVar20,auVar24,4);
  auVar21._16_16_ = auVar9;
  auVar6 = vpermpd_avx2(auVar17,0x24);
  auVar20 = vshufpd_avx(auVar21,auVar20,4);
  auVar17 = vblendpd_avx(auVar15,auVar16,4);
  auVar22._0_8_ = auVar6._0_8_ * auVar20._0_8_;
  auVar22._8_8_ = auVar6._8_8_ * auVar20._8_8_;
  auVar22._16_8_ = auVar6._16_8_ * auVar20._16_8_;
  auVar22._24_8_ = auVar6._24_8_ * auVar20._24_8_;
  auVar13 = vinsertf64x4_avx512f(ZEXT3264(auVar5),auVar17,1);
  auVar14 = vsubpd_avx512f(ZEXT3264(auVar17),auVar11);
  auVar11 = vaddpd_avx512f(auVar13,auVar11);
  auVar13 = vinsertf64x4_avx512f(ZEXT3264(auVar22),auVar22,1);
  auVar13 = vmulpd_avx512f(auVar13,auVar12);
  auVar14 = vshuff64x2_avx512f(auVar14,auVar11,0xe4);
  auVar11._8_8_ = 0xc000000000000000;
  auVar11._0_8_ = 0xc000000000000000;
  auVar11._16_8_ = 0xc000000000000000;
  auVar11._24_8_ = 0xc000000000000000;
  auVar11._32_8_ = 0xc000000000000000;
  auVar11._40_8_ = 0xc000000000000000;
  auVar11._48_8_ = 0xc000000000000000;
  auVar11._56_8_ = 0xc000000000000000;
  auVar11 = vaddpd_avx512f(auVar14,auVar11);
  auVar11 = vmulpd_avx512f(auVar13,auVar11);
  *(undefined1 (*) [64])
   (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array =
       auVar11;
  auVar8._8_8_ = 0x3fd0000000000000;
  auVar8._0_8_ = 0x3fd0000000000000;
  auVar10 = vmulpd_avx512vl(auVar10,auVar8);
  dVar1 = auVar5._0_8_;
  auVar17._0_8_ = auVar10._0_8_ * dVar1;
  auVar17._8_8_ = auVar10._8_8_ * auVar5._8_8_;
  dVar2 = auVar5._16_8_;
  auVar17._16_8_ = auVar10._0_8_ * dVar2;
  auVar17._24_8_ = auVar10._8_8_ * auVar5._24_8_;
  auVar11 = vinsertf64x4_avx512f(ZEXT3264(auVar17),auVar17,1);
  auVar11 = vmulpd_avx512f(auVar11,auVar12);
  *(undefined1 (*) [64])
   ((N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array + 8)
       = auVar11;
  dVar3 = auVar7._0_8_ * 0.25;
  auVar5 = vpermpd_avx2(ZEXT1632(CONCAT88(auVar4._8_8_ * dVar3,auVar4._0_8_ * dVar3)),0x14);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x10] =
       dVar1 * auVar5._0_8_;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x11] =
       dVar1 * auVar5._8_8_;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x12] =
       dVar2 * auVar5._16_8_;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x13] =
       dVar2 * auVar5._24_8_;
  return;
}

Assistant:

void ChElementHexaCorot_20::ShapeFunctions(ShapeVector& N, double r, double s, double t) {
    double rm = 1.0 - r;
    double rp = 1.0 + r;
    double sm = 1.0 - s;
    double sp = 1.0 + s;
    double tm = 1.0 - t;
    double tp = 1.0 + t;
    double r2 = 1.0 - r * r;
    double s2 = 1.0 - s * s;
    double t2 = 1.0 - t * t;

    // The eight corner points
    N(0) = 0.125 * rm * sm * tm * (-r - s - t - 2.0);
    N(1) = 0.125 * rp * sm * tm * (r - s - t - 2.0);
    N(2) = 0.125 * rp * sp * tm * (r + s - t - 2.0);
    N(3) = 0.125 * rm * sp * tm * (-r + s - t - 2.0);
    N(4) = 0.125 * rm * sm * tp * (-r - s + t - 2.0);
    N(5) = 0.125 * rp * sm * tp * (r - s + t - 2.0);
    N(6) = 0.125 * rp * sp * tp * (r + s + t - 2.0);
    N(7) = 0.125 * rm * sp * tp * (-r + s + t - 2.0);

    // The mid-edge nodes
    N(8) = 0.25 * r2 * sm * tm;
    N(9) = 0.25 * s2 * rp * tm;
    N(10) = 0.25 * r2 * sp * tm;
    N(11) = 0.25 * s2 * rm * tm;
    N(12) = 0.25 * r2 * sm * tp;
    N(13) = 0.25 * s2 * rp * tp;
    N(14) = 0.25 * r2 * sp * tp;
    N(15) = 0.25 * s2 * rm * tp;
    N(16) = 0.25 * t2 * rm * sm;
    N(17) = 0.25 * t2 * rp * sm;
    N(18) = 0.25 * t2 * rp * sp;
    N(19) = 0.25 * t2 * rm * sp;
}